

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

Logger * google::base::GetLogger(LogSeverity severity)

{
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *this;
  Logger *pLVar1;
  int iVar2;
  tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_> in_RAX;
  LogDestination *this_00;
  pointer __p;
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>.
  super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
       (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
       (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
       in_RAX.
       super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
       .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
  if (iVar2 == 0) {
    this = (__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
           (&LogDestination::log_destinations_ + severity);
    if ((this->_M_t).
        super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
        .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl ==
        (LogDestination *)0x0) {
      this_00 = (LogDestination *)operator_new(0xd0);
      LogDestination::LogDestination(this_00,severity,(char *)0x0);
      local_28._M_t.
      super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
      .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
           (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
           (_Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
           )0x0;
      std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
      reset(this,this_00);
      std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
      ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                   *)&local_28);
    }
    pLVar1 = ((this->_M_t).
              super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
              .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl)->logger_;
    pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
    return pLVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

base::Logger* base::GetLogger(LogSeverity severity) {
  std::lock_guard<std::mutex> l{log_mutex};
  return LogDestination::log_destination(severity)->GetLoggerImpl();
}